

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::core::Engine::DoPutSync(Engine *this,Variable<float> *param_1,float *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"DoPutSync",&local_31);
  ThrowUp(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Engine::DoPutStructSync(VariableStruct &, const void *) { ThrowUp("DoPutStructSync"); }